

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_CopyConstructEmptyWithDefault_Test::TestBody
          (SingleArena_CopyConstructEmptyWithDefault_Test *this)

{
  bool bVar1;
  pointer arena_00;
  string *lhs;
  char *pcVar2;
  char *in_R9;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  ArenaStringPtr dst;
  LazyString default_value;
  ArenaStringPtr field;
  undefined1 local_38 [8];
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  string empty;
  SingleArena_CopyConstructEmptyWithDefault_Test *this_local;
  
  std::__cxx11::string::string((string *)&arena);
  SingleArena::GetArena((SingleArena *)local_38);
  internal::ArenaStringPtr::InitExternal((ArenaStringPtr *)&default_value.inited_,(string *)&arena);
  default_value.field_0._24_8_ = 0;
  default_value.field_0.init_value_.size = 0;
  default_value.field_0._16_8_ = 0;
  dst.tagged_ptr_.ptr_ = (TaggedStringPtr)anon_var_dwarf_a7e2b;
  default_value.field_0.init_value_.ptr = (char *)0xd;
  arena_00 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
             ::get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                    *)local_38);
  internal::ArenaStringPtr::ArenaStringPtr
            ((ArenaStringPtr *)&gtest_ar.message_,arena_00,(ArenaStringPtr *)&default_value.inited_,
             (LazyString *)&dst);
  lhs = internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_90,"dst.Get()","\"\"",lhs,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_b1 = internal::ArenaStringPtr::IsDefault((ArenaStringPtr *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_b0,(AssertionResult *)"dst.IsDefault()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  bVar1 = std::operator==((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                           *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&gtest_ar.message_);
  }
  internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&default_value.inited_);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_38);
  std::__cxx11::string::~string((string *)&arena);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructEmptyWithDefault) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);

  internal::LazyString default_value{{{"Hello default", 13}}, {nullptr}};
  ArenaStringPtr dst(arena.get(), field, default_value);
  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_EQ(dst.Get(), "Hello default");
    EXPECT_FALSE(dst.IsDefault());
  } else {
    EXPECT_EQ(dst.Get(), "");
    EXPECT_TRUE(dst.IsDefault());
  }
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}